

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

Character * __thiscall Map::GetCharacter(Map *this,string *name)

{
  bool bVar1;
  int iVar2;
  reference ppCVar3;
  string local_80 [32];
  Character *local_60;
  Character *character;
  iterator __end1;
  iterator __begin1;
  list<Character_*,_std::allocator<Character_*>_> *__range1;
  string *local_20;
  string *name_local;
  Map *this_local;
  
  local_20 = name;
  name_local = (string *)this;
  util::lowercase((string *)&__range1,name);
  std::__cxx11::string::operator=((string *)name,(string *)&__range1);
  std::__cxx11::string::~string((string *)&__range1);
  __end1 = std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::begin(&this->characters);
  character = (Character *)
              std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::end(&this->characters);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&character);
    if (!bVar1) {
      return (Character *)0x0;
    }
    ppCVar3 = std::_List_iterator<Character_*>::operator*(&__end1);
    local_60 = *ppCVar3;
    (*(local_60->super_Command_Source)._vptr_Command_Source[2])();
    iVar2 = std::__cxx11::string::compare(local_80);
    std::__cxx11::string::~string(local_80);
    if (iVar2 == 0) break;
    std::_List_iterator<Character_*>::operator++(&__end1);
  }
  return local_60;
}

Assistant:

Character *Map::GetCharacter(std::string name)
{
	name = util::lowercase(name);

	UTIL_FOREACH(this->characters, character)
	{
		if (character->SourceName().compare(name) == 0)
		{
			return character;
		}
	}

	return 0;
}